

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

void __thiscall OrPattern::saveXml(OrPattern *this,ostream *s)

{
  pointer ppDVar1;
  DisjointPattern *pDVar2;
  int4 i;
  ulong uVar3;
  
  std::operator<<(s,"<or_pat>\n");
  uVar3 = 0;
  while( true ) {
    ppDVar1 = (this->orlist).
              super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->orlist).
                      super__Vector_base<DisjointPattern_*,_std::allocator<DisjointPattern_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3) <= uVar3)
    break;
    pDVar2 = ppDVar1[uVar3];
    (*(pDVar2->super_Pattern)._vptr_Pattern[0xd])(pDVar2,s);
    uVar3 = uVar3 + 1;
  }
  std::operator<<(s,"</or_pat>\n");
  return;
}

Assistant:

void OrPattern::saveXml(ostream &s) const

{
  s << "<or_pat>\n";
  for(int4 i=0;i<orlist.size();++i)
    orlist[i]->saveXml(s);
  s << "</or_pat>\n";
}